

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::read_reference
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write,
          ReturnType t)

{
  ushort uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ImageObject *pIVar4;
  pointer psVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  iterator iVar9;
  Atom *pAVar10;
  ulong uVar11;
  undefined6 in_register_00000012;
  ushort uVar12;
  undefined7 in_register_00000081;
  ushort uVar13;
  undefined4 uVar14;
  ushort *puVar15;
  uint32_t cast_opcode;
  uint16_t index;
  vector<short,_std::allocator<short>_> v;
  Atom aAStack_b8 [4];
  Atom local_b4 [6];
  ushort local_ae;
  undefined4 local_ac;
  vector<short,_std::allocator<short>_> local_a8;
  uint local_84;
  Ptr local_80;
  Ptr local_70;
  Ptr local_60;
  Ptr local_50;
  Ptr local_40;
  
  local_ac = (undefined4)CONCAT71(in_register_00000081,write);
  if (((t == ANY) || ((this->current_class).type == t)) &&
     (iVar8 = std::__cxx11::string::compare
                        ((char *)&((node->
                                   super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->cmd), iVar8 == 0)) {
    if ((char)local_ac == '\0') {
      return true;
    }
    r_code::Atom::This();
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(pAVar10,(Atom *)&local_a8);
LAB_0012e843:
    r_code::Atom::~Atom((Atom *)&local_a8);
    return true;
  }
  peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_84 = (uint)CONCAT62(in_register_00000012,write_index);
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->local_references)._M_h,&peVar2->cmd);
  if ((iVar9.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
       ._M_cur == (__node_type *)0x0) ||
     ((t != ANY &&
      (*(ReturnType *)
        ((long)iVar9.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
               ._M_cur + 0x70) != t)))) {
    bVar7 = false;
  }
  else {
    local_ae = *(ushort *)
                ((long)iVar9.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                       ._M_cur + 0x28);
    bVar7 = true;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  uVar6 = local_84;
  if (bVar7) {
    if ((char)local_ac == '\0') {
      return true;
    }
    r_code::Atom::VLPointer((ushort)&local_a8,local_ae);
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(ushort)local_84)
    ;
    r_code::Atom::operator=(pAVar10,(Atom *)&local_a8);
    goto LAB_0012e843;
  }
  local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  bVar7 = global_reference(this,&local_40,&local_ae,t);
  if (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar7) {
    if ((char)local_ac == '\0') {
      return true;
    }
    r_code::Atom::RPointer((ushort)&local_a8);
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar6 & 0xffff))
    ;
    r_code::Atom::operator=(pAVar10,(Atom *)&local_a8);
    goto LAB_0012e843;
  }
  local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  bVar7 = this_indirection(this,&local_50,&local_a8,t);
  if (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar7) {
    bVar7 = true;
    if ((char)local_ac == '\0') goto LAB_0012efe6;
    r_code::Atom::IPointer((ushort)local_b4);
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar6 & 0xffff))
    ;
    r_code::Atom::operator=(pAVar10,local_b4);
    r_code::Atom::~Atom(local_b4);
    r_code::Atom::CPointer((uchar)local_b4);
    pIVar4 = this->current_object;
    uVar12 = *extent_index;
    *extent_index = uVar12 + 1;
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar12);
    r_code::Atom::operator=(pAVar10,local_b4);
    r_code::Atom::~Atom(local_b4);
    r_code::Atom::This();
    pIVar4 = this->current_object;
    uVar12 = *extent_index;
    *extent_index = uVar12 + 1;
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar12);
    r_code::Atom::operator=(pAVar10,local_b4);
    r_code::Atom::~Atom(local_b4);
    psVar5 = local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      bVar7 = true;
      goto LAB_0012efe6;
    }
    puVar15 = (ushort *)
              local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar12 = *puVar15;
      if (uVar12 == 0xfffd) {
        r_code::Atom::Vws();
        pIVar4 = this->current_object;
        uVar12 = *extent_index;
        *extent_index = uVar12 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar12);
        r_code::Atom::operator=(pAVar10,local_b4);
      }
      else if (uVar12 == 0xfffe) {
        r_code::Atom::Mks();
        pIVar4 = this->current_object;
        uVar12 = *extent_index;
        *extent_index = uVar12 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar12);
        r_code::Atom::operator=(pAVar10,local_b4);
      }
      else if (uVar12 == 0xffff) {
        r_code::Atom::View();
        pIVar4 = this->current_object;
        uVar12 = *extent_index;
        *extent_index = uVar12 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar12);
        r_code::Atom::operator=(pAVar10,local_b4);
      }
      else {
        r_code::Atom::IPointer((ushort)local_b4);
        pIVar4 = this->current_object;
        uVar12 = *extent_index;
        *extent_index = uVar12 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar12);
        r_code::Atom::operator=(pAVar10,local_b4);
      }
      r_code::Atom::~Atom(local_b4);
      puVar15 = puVar15 + 1;
    } while (puVar15 != (ushort *)psVar5);
  }
  else {
    local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar7 = local_indirection(this,&local_60,&local_a8,t,(uint32_t *)local_b4);
    if (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uVar12 = (ushort)aAStack_b8;
    if (bVar7) {
      bVar7 = true;
      if ((char)local_ac != '\0') {
        r_code::Atom::IPointer(uVar12);
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),
                             (ulong)(uVar6 & 0xffff));
        r_code::Atom::operator=(pAVar10,aAStack_b8);
        r_code::Atom::~Atom(aAStack_b8);
        r_code::Atom::CPointer((uchar)aAStack_b8);
        pIVar4 = this->current_object;
        uVar13 = *extent_index;
        *extent_index = uVar13 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar13);
        r_code::Atom::operator=(pAVar10,aAStack_b8);
        r_code::Atom::~Atom(aAStack_b8);
        r_code::Atom::VLPointer
                  (uVar12,*local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_start);
        pIVar4 = this->current_object;
        uVar13 = *extent_index;
        *extent_index = uVar13 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar13);
        r_code::Atom::operator=(pAVar10,aAStack_b8);
        r_code::Atom::~Atom(aAStack_b8);
        if (2 < (ulong)((long)local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          uVar11 = 1;
          uVar13 = 2;
          do {
            uVar1 = local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
            if (uVar1 == 0xfffd) {
              r_code::Atom::Vws();
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            else if (uVar1 == 0xfffe) {
              r_code::Atom::Mks();
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            else if (uVar1 == 0xffff) {
              r_code::Atom::View();
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            else {
              r_code::Atom::IPointer(uVar12);
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            r_code::Atom::~Atom(aAStack_b8);
            uVar11 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
          } while (uVar11 < (ulong)((long)local_a8.super__Vector_base<short,_std::allocator<short>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_a8.super__Vector_base<short,_std::allocator<short>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 1));
        }
      }
      goto LAB_0012efe6;
    }
    local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar7 = global_indirection(this,&local_70,&local_a8,t);
    if (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (bVar7) {
      bVar7 = true;
      if ((char)local_ac != '\0') {
        r_code::Atom::IPointer(uVar12);
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),
                             (ulong)(uVar6 & 0xffff));
        r_code::Atom::operator=(pAVar10,aAStack_b8);
        r_code::Atom::~Atom(aAStack_b8);
        r_code::Atom::CPointer((uchar)aAStack_b8);
        pIVar4 = this->current_object;
        uVar13 = *extent_index;
        *extent_index = uVar13 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar13);
        r_code::Atom::operator=(pAVar10,aAStack_b8);
        r_code::Atom::~Atom(aAStack_b8);
        r_code::Atom::RPointer(uVar12);
        pIVar4 = this->current_object;
        uVar13 = *extent_index;
        *extent_index = uVar13 + 1;
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar13);
        r_code::Atom::operator=(pAVar10,aAStack_b8);
        r_code::Atom::~Atom(aAStack_b8);
        if (2 < (ulong)((long)local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          uVar11 = 1;
          uVar13 = 2;
          do {
            if (local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11] == 0xfffd) {
              r_code::Atom::Vws();
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            else if (local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11] == 0xfffe) {
              r_code::Atom::Mks();
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            else {
              r_code::Atom::IPointer(uVar12);
              pIVar4 = this->current_object;
              uVar1 = *extent_index;
              *extent_index = uVar1 + 1;
              pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar4 + 8),(ulong)uVar1);
              r_code::Atom::operator=(pAVar10,aAStack_b8);
            }
            r_code::Atom::~Atom(aAStack_b8);
            uVar11 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
          } while (uVar11 < (ulong)((long)local_a8.super__Vector_base<short,_std::allocator<short>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_a8.super__Vector_base<short,_std::allocator<short>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 1));
        }
      }
      goto LAB_0012efe6;
    }
    local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var3 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    local_80.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar7 = hlp_reference(this,&local_80,&local_ae);
      uVar14 = local_ac;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        bVar7 = hlp_reference(this,&local_80,&local_ae);
        uVar14 = local_ac;
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012ef9c;
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        bVar7 = hlp_reference(this,&local_80,&local_ae);
      }
      uVar14 = local_ac;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
LAB_0012ef9c:
    if (((byte)uVar14 & bVar7) != 1) goto LAB_0012efe6;
    r_code::Atom::VLPointer(uVar12,local_ae);
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(uVar6 & 0xffff))
    ;
    r_code::Atom::operator=(pAVar10,aAStack_b8);
    r_code::Atom::~Atom(aAStack_b8);
  }
  bVar7 = true;
LAB_0012efe6:
  if ((ushort *)
      local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start == (ushort *)0x0) {
    return bVar7;
  }
  operator_delete(local_a8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return bVar7;
}

Assistant:

bool Compiler::read_reference(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write, const ReturnType t)
{
    uint16_t index;

    if ((t == ANY || (t != ANY && current_class.type == t)) && node->cmd == "this") {
        if (write) {
            current_object->code[write_index] = Atom::This();
        }

        return true;
    }

    if (local_reference(node, index, t)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);    // local references are always pointing to the value array
        }

        return true;
    }

    if (global_reference(node, index, t)) { // index is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::RPointer(index);
        }

        return true;
    }

    std::vector<int16_t> v;

    if (this_indirection(node, v, t)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size() + 1);
            current_object->code[extent_index++] = Atom::This();

            for (int16_t type : v) {
                switch (type) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(type);
                    break;
                }
            }
        }

        return true;
    }

    uint32_t cast_opcode;

    if (local_indirection(node, v, t, cast_opcode)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::VLPointer(v[0], cast_opcode);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (global_indirection(node, v, t)) { // v[0] is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::RPointer(v[0]);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (hlp_reference(node, index)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);
        }

        return true;
    }

    return false;
}